

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.h
# Opt level: O0

int sat_solver_add_and(sat_solver *pSat,int iVar,int iVar0,int iVar1,int fCompl0,int fCompl1,
                      int fCompl)

{
  int iVar2;
  lit local_30;
  int Cid;
  lit Lits [3];
  int fCompl1_local;
  int fCompl0_local;
  int iVar1_local;
  int iVar0_local;
  int iVar_local;
  sat_solver *pSat_local;
  
  Lits[1] = fCompl1;
  Lits[2] = fCompl0;
  local_30 = toLitCond(iVar,(uint)((fCompl != 0 ^ 0xffU) & 1));
  Cid = toLitCond(iVar0,Lits[2]);
  iVar2 = sat_solver_addclause(pSat,&local_30,Lits);
  if (iVar2 == 0) {
    __assert_fail("Cid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                  ,0x162,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)");
  }
  local_30 = toLitCond(iVar,(uint)((fCompl != 0 ^ 0xffU) & 1));
  Cid = toLitCond(iVar1,Lits[1]);
  iVar2 = sat_solver_addclause(pSat,&local_30,Lits);
  if (iVar2 != 0) {
    local_30 = toLitCond(iVar,fCompl);
    Cid = toLitCond(iVar0,(uint)((Lits[2] != 0 ^ 0xffU) & 1));
    Lits[0] = toLitCond(iVar1,(uint)((Lits[1] != 0 ^ 0xffU) & 1));
    iVar2 = sat_solver_addclause(pSat,&local_30,Lits + 1);
    if (iVar2 != 0) {
      return 3;
    }
    __assert_fail("Cid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                  ,0x16d,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)");
  }
  __assert_fail("Cid",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                ,0x167,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)");
}

Assistant:

static inline int sat_solver_add_and( sat_solver * pSat, int iVar, int iVar0, int iVar1, int fCompl0, int fCompl1, int fCompl )
{
    lit Lits[3];
    int Cid;

    Lits[0] = toLitCond( iVar, !fCompl );
    Lits[1] = toLitCond( iVar0, fCompl0 );
    Cid = sat_solver_addclause( pSat, Lits, Lits + 2 );
    assert( Cid );

    Lits[0] = toLitCond( iVar, !fCompl );
    Lits[1] = toLitCond( iVar1, fCompl1 );
    Cid = sat_solver_addclause( pSat, Lits, Lits + 2 );
    assert( Cid );

    Lits[0] = toLitCond( iVar, fCompl );
    Lits[1] = toLitCond( iVar0, !fCompl0 );
    Lits[2] = toLitCond( iVar1, !fCompl1 );
    Cid = sat_solver_addclause( pSat, Lits, Lits + 3 );
    assert( Cid );
    return 3;
}